

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_module.cpp
# Opt level: O3

Id __thiscall dxil_spv::SPIRVModule::get_builtin_shader_output(SPIRVModule *this,BuiltIn builtin)

{
  Id IVar1;
  iterator iVar2;
  key_type local_4;
  
  iVar2 = std::
          _Hashtable<spv::BuiltIn,_std::pair<const_spv::BuiltIn,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_spv::BuiltIn,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<spv::BuiltIn>,_std::hash<spv::BuiltIn>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(((this->impl)._M_t.
                    super___uniq_ptr_impl<dxil_spv::SPIRVModule::Impl,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_dxil_spv::SPIRVModule::Impl_*,_std::default_delete<dxil_spv::SPIRVModule::Impl>_>
                    .super__Head_base<0UL,_dxil_spv::SPIRVModule::Impl_*,_false>._M_head_impl)->
                  builtins_output)._M_h,&local_4);
  if (iVar2.super__Node_iterator_base<std::pair<const_spv::BuiltIn,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    IVar1 = 0;
  }
  else {
    IVar1 = *(Id *)((long)iVar2.
                          super__Node_iterator_base<std::pair<const_spv::BuiltIn,_unsigned_int>,_false>
                          ._M_cur + 0xc);
  }
  return IVar1;
}

Assistant:

spv::Id SPIRVModule::get_builtin_shader_output(spv::BuiltIn builtin)
{
	return impl->get_builtin_shader_output(builtin);
}